

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O2

gboolean idleTimerSourcePrepare(GSource *source,gint *timeout)

{
  gpointer pvVar1;
  uint uVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar3;
  long lVar4;
  gint gVar5;
  long lVar7;
  long in_FS_OFFSET;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar8;
  duration<long,_std::ratio<1L,_1000L>_> dStack_28;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> _Stack_20;
  undefined1 uStack_18;
  long lStack_10;
  long lVar6;
  
  pvVar1 = source[1].callback_data;
  if (*(char *)((long)pvVar1 + 0x8c) == '\0') {
    if (timeout != (gint *)0x0) {
      *timeout = -1;
    }
    return 0;
  }
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)pvVar1 + 0x88) & 8) == 0) {
    oVar8 = QTimerInfoList::timerWait((QTimerInfoList *)((long)pvVar1 + 0x60));
    _Stack_20 = oVar8.
                super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ._M_payload;
    uStack_18 = oVar8.
                super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                ._M_engaged;
    dStack_28.__r = -1;
    dVar3 = std::optional<std::chrono::duration<long,std::ratio<1l,1000000000l>>>::
            value_or<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      ((optional<std::chrono::duration<long,std::ratio<1l,1000000000l>>> *)
                       &_Stack_20._M_value,&dStack_28);
    lVar7 = (ulong)((dVar3.__r / 1000000) * 1000000 < dVar3.__r) + dVar3.__r / 1000000;
    lVar4 = 0x7fffffff;
    if (lVar7 < 0x7fffffff) {
      lVar4 = lVar7;
    }
    lVar6 = -0x80000000;
    if (-0x80000000 < lVar4) {
      lVar6 = lVar4;
    }
    gVar5 = (gint)lVar6;
    uVar2 = (uint)(lVar7 == 0);
  }
  else {
    uVar2 = 1;
    gVar5 = -1;
  }
  *timeout = gVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_10) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static gboolean idleTimerSourcePrepare(GSource *source, gint *timeout)
{
    GIdleTimerSource *idleTimerSource = reinterpret_cast<GIdleTimerSource *>(source);
    GTimerSource *timerSource = idleTimerSource->timerSource;
    if (!timerSource->runWithIdlePriority) {
        // Yield to the normal priority timer source
        if (timeout)
            *timeout = -1;
        return false;
    }

    return timerSourcePrepareHelper(timerSource, timeout);
}